

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::PickerPrivate::initDrawOffsetForFirstUse(PickerPrivate *this)

{
  int iVar1;
  int iVar2;
  
  if (this->wasPainted == false) {
    iVar1 = Picker::count(this->q);
    iVar2 = this->itemsCount;
    if (iVar1 < iVar2) {
      iVar1 = Picker::count(this->q);
      iVar2 = iVar2 - iVar1;
      iVar1 = 0;
      if (0 < iVar2) {
        iVar1 = iVar2 + -1;
      }
      this->drawItemOffset = (iVar1 * this->itemTopMargin + this->stringHeight * iVar2) / 2;
      this->wasPainted = true;
    }
  }
  return;
}

Assistant:

void
PickerPrivate::initDrawOffsetForFirstUse()
{
	if( !wasPainted && q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		drawItemOffset = maxOffset / 2;

		wasPainted = true;
	}
}